

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

String * __thiscall efsw::String::toAnsiString_abi_cxx11_(String *this,locale *locale)

{
  const_iterator begin;
  const_iterator end;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  output_00;
  locale *in_RDX;
  locale *locale_local;
  String *this_local;
  string *output;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
  length((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)locale);
  std::__cxx11::string::reserve((ulong)this);
  begin = std::__cxx11::
          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::begin
                    ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                      *)locale);
  end = std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
        ::end((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
              locale);
  output_00 = std::back_inserter<std::__cxx11::string>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  Utf<32u>::
  ToAnsi<__gnu_cxx::__normal_iterator<char32_t_const*,std::__cxx11::u32string>,std::back_insert_iterator<std::__cxx11::string>>
            ((__normal_iterator<const_char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
              )begin._M_current,
             (__normal_iterator<const_char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
              )end._M_current,output_00,'\0',in_RDX);
  return this;
}

Assistant:

std::string String::toAnsiString( const std::locale& locale ) const {
	// Prepare the output string
	std::string output;
	output.reserve( mString.length() + 1 );

	// Convert
	Utf32::ToAnsi( mString.begin(), mString.end(), std::back_inserter( output ), 0, locale );

	return output;
}